

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  Instruction *this_00;
  pointer ppIVar1;
  bool bVar2;
  uint32_t sampled_image_type_id;
  Instruction *image_extraction;
  Status SVar3;
  pointer ppIVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_variable_loads;
  
  image_variable_loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image_variable_loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  image_variable_loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindUses(this,image_variable,&image_variable_loads,OpLoad);
  if (image_variable_loads.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      image_variable_loads.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SVar3 = SuccessWithoutChange;
  }
  else {
    sampled_image_type_id = GetSampledImageTypeForImage(this,image_variable);
    ppIVar1 = image_variable_loads.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar4 = image_variable_loads.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (sampled_image_type_id == 0) {
      SVar3 = Failure;
    }
    else {
      for (; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
        this_00 = *ppIVar4;
        Instruction::SetResultType(this_00,sampled_image_type_id);
        image_extraction = UpdateImageUses(this,this_00);
        UpdateSampledImageUses(this,this_00,image_extraction,descriptor_set_binding);
      }
      bVar2 = ConvertImageVariableToSampledImage(this,image_variable,sampled_image_type_id);
      SVar3 = (uint)bVar2 << 4;
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&image_variable_loads.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return SVar3;
}

Assistant:

Pass::Status ConvertToSampledImagePass::UpdateImageVariableToSampledImage(
    Instruction* image_variable,
    const DescriptorSetAndBinding& descriptor_set_binding) {
  std::vector<Instruction*> image_variable_loads;
  FindUses(image_variable, &image_variable_loads, spv::Op::OpLoad);
  if (image_variable_loads.empty()) return Status::SuccessWithoutChange;

  const uint32_t sampled_image_type_id =
      GetSampledImageTypeForImage(image_variable);
  if (!sampled_image_type_id) return Status::Failure;

  for (auto* load : image_variable_loads) {
    load->SetResultType(sampled_image_type_id);
    auto* image_extraction = UpdateImageUses(load);
    UpdateSampledImageUses(load, image_extraction, descriptor_set_binding);
  }

  return ConvertImageVariableToSampledImage(image_variable,
                                            sampled_image_type_id)
             ? Status::SuccessWithChange
             : Status::Failure;
}